

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

Vec_Wrd_t * Abc_SuppDiffMatrix(Vec_Wrd_t *vCubes)

{
  ulong *puVar1;
  int iVar2;
  ulong *__src;
  ulong *puVar3;
  Vec_Wrd_t *pVVar4;
  word *__dest;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong *puVar8;
  int level;
  long lVar9;
  ulong *puVar10;
  ulong *puVar11;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  puVar10 = vCubes->pArray;
  iVar2 = vCubes->nSize;
  uVar5 = ((iVar2 + -1) * iVar2) / 2;
  uVar7 = 0x10;
  if (0xe < uVar5 - 1) {
    uVar7 = uVar5;
  }
  lVar9 = (long)(int)uVar7;
  if (uVar7 == 0) {
    __src = (ulong *)0x0;
  }
  else {
    __src = (ulong *)malloc(lVar9 * 8);
  }
  puVar3 = __src;
  if (0 < iVar2) {
    puVar1 = puVar10 + iVar2;
    do {
      puVar11 = puVar10 + 1;
      for (puVar8 = puVar11; puVar8 < puVar1; puVar8 = puVar8 + 1) {
        *puVar3 = *puVar8 ^ *puVar10;
        puVar3 = puVar3 + 1;
      }
      puVar10 = puVar11;
    } while (puVar11 < puVar1);
  }
  if (puVar3 == __src + lVar9) {
    pVVar4 = (Vec_Wrd_t *)malloc(0x10);
    pVVar4->nSize = uVar7;
    pVVar4->nCap = uVar7;
    if (uVar7 == 0) {
      __dest = (word *)0x0;
    }
    else {
      __dest = (word *)malloc(lVar9 * 8);
    }
    pVVar4->pArray = __dest;
    memcpy(__dest,__src,lVar9 << 3);
    printf("Successfully generated diff matrix with %10d rows (%6.2f %%).  ",
           ((double)(int)uVar7 * 100.0) / (double)(int)uVar7,(ulong)uVar7);
    level = 3;
    iVar2 = clock_gettime(3,&local_40);
    if (iVar2 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar9 + lVar6) / 1000000.0);
    if (__src != (ulong *)0x0) {
      free(__src);
    }
    return pVVar4;
  }
  __assert_fail("pStore == Vec_WrdLimit(vPairs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilSupp.c"
                ,0x176,"Vec_Wrd_t *Abc_SuppDiffMatrix(Vec_Wrd_t *)");
}

Assistant:

Vec_Wrd_t * Abc_SuppDiffMatrix( Vec_Wrd_t * vCubes )
{
    abctime clk = Abc_Clock();
    word * pEnt2, * pEnt = Vec_WrdArray( vCubes );
    word * pLimit = Vec_WrdLimit( vCubes );
    Vec_Wrd_t * vRes, * vPairs = Vec_WrdAlloc( Vec_WrdSize(vCubes) * (Vec_WrdSize(vCubes) - 1) / 2 );
    word * pStore = Vec_WrdArray( vPairs );
    for ( ; pEnt < pLimit; pEnt++ )
    for ( pEnt2 = pEnt+1; pEnt2 < pLimit; pEnt2++ )
        *pStore++ = *pEnt ^ *pEnt2;
    vPairs->nSize = Vec_WrdCap(vPairs);
    assert( pStore == Vec_WrdLimit(vPairs) );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    vRes = Vec_WrdUniqifyHash( vPairs, 1 );
    vRes = Vec_WrdDup( vPairs );
    printf( "Successfully generated diff matrix with %10d rows (%6.2f %%).  ", 
        Vec_WrdSize(vRes), 100.0 * Vec_WrdSize(vRes) / Vec_WrdSize(vPairs) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_WrdFree( vPairs );
    return vRes;    
}